

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

size_t mpn_get_str_other(uchar *sp,int base,mpn_base_info *info,mp_ptr up,mp_size_t un)

{
  uchar uVar1;
  mp_limb_t w_00;
  size_t sVar2;
  ulong uVar3;
  size_t sStack_90;
  uchar t;
  size_t done;
  mp_limb_t w;
  gmp_div_inverse bbinv;
  size_t i;
  size_t sn;
  gmp_div_inverse binv;
  mp_size_t un_local;
  mp_ptr up_local;
  mpn_base_info *info_local;
  int base_local;
  uchar *sp_local;
  
  binv.di = un;
  mpn_div_qr_1_invert((gmp_div_inverse *)&sn,(long)base);
  i = 0;
  if (1 < (long)binv.di) {
    mpn_div_qr_1_invert((gmp_div_inverse *)&w,info->bb);
    do {
      w_00 = mpn_div_qr_1_preinv(up,up,binv.di,(gmp_div_inverse *)&w);
      binv.di = binv.di - (long)(int)(uint)(up[binv.di - 1] == 0);
      sStack_90 = mpn_limb_get_str(sp + i,w_00,(gmp_div_inverse *)&sn);
      i = sStack_90 + i;
      for (; sStack_90 < info->exp; sStack_90 = sStack_90 + 1) {
        sp[i] = '\0';
        i = i + 1;
      }
    } while (1 < (long)binv.di);
  }
  sVar2 = mpn_limb_get_str(sp + i,*up,(gmp_div_inverse *)&sn);
  uVar3 = sVar2 + i;
  for (bbinv.di = 0; bbinv.di * 2 + 1 < uVar3; bbinv.di = bbinv.di + 1) {
    uVar1 = sp[bbinv.di];
    sp[bbinv.di] = sp[(uVar3 - bbinv.di) + -1];
    sp[(uVar3 - bbinv.di) + -1] = uVar1;
  }
  return uVar3;
}

Assistant:

static size_t
mpn_get_str_other (unsigned char *sp,
		   int base, const struct mpn_base_info *info,
		   mp_ptr up, mp_size_t un)
{
  struct gmp_div_inverse binv;
  size_t sn;
  size_t i;

  mpn_div_qr_1_invert (&binv, base);

  sn = 0;

  if (un > 1)
    {
      struct gmp_div_inverse bbinv;
      mpn_div_qr_1_invert (&bbinv, info->bb);

      do
	{
	  mp_limb_t w;
	  size_t done;
	  w = mpn_div_qr_1_preinv (up, up, un, &bbinv);
	  un -= (up[un-1] == 0);
	  done = mpn_limb_get_str (sp + sn, w, &binv);

	  for (sn += done; done < info->exp; done++)
	    sp[sn++] = 0;
	}
      while (un > 1);
    }
  sn += mpn_limb_get_str (sp + sn, up[0], &binv);

  /* Reverse order */
  for (i = 0; 2*i + 1 < sn; i++)
    {
      unsigned char t = sp[i];
      sp[i] = sp[sn - i - 1];
      sp[sn - i - 1] = t;
    }

  return sn;
}